

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O1

uint32_t getDFDNumComponents(uint32_t *DFD)

{
  uint32_t uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (DFD[2] >> 0x12) - 6;
  uVar1 = 0;
  if (3 < uVar2) {
    uVar2 = uVar2 >> 2;
    lVar3 = 0;
    uVar1 = 0;
    uVar4 = 0xffffffff;
    do {
      uVar5 = *(byte *)((long)DFD + lVar3 + 0x1f) & 0xf;
      uVar1 = uVar1 + (uVar5 != uVar4);
      lVar3 = lVar3 + 0x10;
      uVar4 = uVar5;
    } while ((ulong)(uVar2 + (uVar2 == 0)) << 4 != lVar3);
  }
  return uVar1;
}

Assistant:

uint32_t getDFDNumComponents(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t currentChannel = ~0U; /* Don't start matched. */
    uint32_t numComponents = 0;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleNumber, CHANNELID);
        if (sampleChannel != currentChannel) {
            numComponents++;
            currentChannel = sampleChannel;
        }
    }
    return numComponents;
}